

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast_pybind_ur5e.cpp
# Opt level: O2

PyObject * PyInit_ikfast_ur5e(void)

{
  module_ mVar1;
  cpp_function cVar2;
  int iVar3;
  char *__s1;
  __uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  local_a8;
  module_ m;
  cpp_function func_2;
  cpp_function func_1;
  cpp_function func;
  accessor<pybind11::detail::accessor_policies::str_attr> local_70;
  handle local_50;
  object local_48;
  PyObject *local_40;
  object local_38;
  char *local_30;
  
  __s1 = (char *)Py_GetVersion();
  iVar3 = strncmp(__s1,"3.10",4);
  if ((iVar3 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::detail::get_internals();
    pybind11::module_::create_extension_module
              (&m,"ikfast_ur5e",(char *)0x0,&pybind11_module_def_ikfast_ur5e);
    local_70.obj.m_ptr = (PyObject *)m.super_object.super_handle.m_ptr;
    local_70.key = "__doc__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_70,
               (char (*) [182])
               "\n        ur5e\n        -----------------------\n        .. currentmodule:: ikfast_ur5e\n        .. autosummary::\n           :toctree: _generate\n           get_ik\n           get_fk\n    "
              );
    pybind11::object::~object(&local_70.cache);
    local_70._0_8_ = "trans_list";
    local_70.obj.m_ptr = (PyObject *)((ulong)local_70.obj.m_ptr & 0xfffffffffffffffc | 2);
    func_2.super_function.super_object.super_handle.m_ptr = (function)anon_var_dwarf_34dd4;
    func_1.super_function.super_object.super_handle.m_ptr = (function)anon_var_dwarf_34de0;
    local_30 = "get_ik";
    local_38.super_handle.m_ptr = (handle)(handle)m.super_object.super_handle.m_ptr;
    local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)&local_50,(handle)m.super_object.super_handle.m_ptr,"get_ik",
                      (PyObject *)&_Py_NoneStruct);
    local_40 = local_50.m_ptr;
    func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pybind11::cpp_function::make_function_record((cpp_function *)&local_a8);
    *(code **)((long)local_a8._M_t.
                     super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                     .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl
              + 0x30) =
         pybind11::cpp_function::
         initialize<pybind11_init_ikfast_ur5e(pybind11::module_&)::$_0,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,std::vector<double,std::allocator<double>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,char[55]>(pybind11_init_ikfast_ur5e(pybind11::module_&)::$_0&&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>(*)(std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,std::vector<double,std::allocator<double>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,pybind11::arg_const&,pybind11::arg_const&,char_const(&)[55])
         ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pybind11::detail::
    process_attributes<pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[55]>
    ::init((EVP_PKEY_CTX *)&local_30);
    pybind11::cpp_function::initialize_generic
              (&func,(unique_function_record *)&local_a8,
               "({List[float]}, {List[List[float]]}, {List[float]}) -> List[List[float]]",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_ur5e(pybind11::module_&)::$_0,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,std::vector<double,std::allocator<double>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,char[55]>(pybind11_init_ikfast_ur5e(pybind11::module_&)::$_0&&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>(*)(std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,std::vector<double,std::allocator<double>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,pybind11::arg_const&,pybind11::arg_const&,char_const&[])
                ::types,3);
    std::
    unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   *)&local_a8);
    pybind11::object::~object((object *)&local_50);
    pybind11::object::~object(&local_48);
    pybind11::module_::add_object
              (&m,"get_ik",(handle)func.super_function.super_object.super_handle.m_ptr,true);
    pybind11::object::~object((object *)&func);
    mVar1 = m;
    local_70._0_8_ = anon_var_dwarf_34e04;
    local_70.obj.m_ptr = (PyObject *)((ulong)local_70.obj.m_ptr & 0xfffffffffffffffc | 2);
    func.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)&local_a8,(handle)m.super_object.super_handle.m_ptr,"get_fk",
                      (PyObject *)&_Py_NoneStruct);
    func_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pybind11::cpp_function::make_function_record(&func_2);
    cVar2 = func_2;
    *(code **)((long)func_2.super_function.super_object.super_handle.m_ptr + 0x30) =
         pybind11::cpp_function::
         initialize<pybind11_init_ikfast_ur5e(pybind11::module_&)::$_1,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,std::vector<double,std::allocator<double>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[55]>(pybind11_init_ikfast_ur5e(pybind11::module_&)::$_1&&,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>(*)(std::vector<double,std::allocator<double>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const(&)[55])
         ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    *(char **)func_2.super_function.super_object.super_handle.m_ptr = "get_fk";
    ((object *)((long)func_2.super_function.super_object.super_handle.m_ptr + 0x70))->super_handle =
         (handle)mVar1.super_object.super_handle.m_ptr;
    ((tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      *)((long)func_2.super_function.super_object.super_handle.m_ptr + 0x78))->
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         = (_Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            )local_a8._M_t.
             super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
             .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
    pybind11::detail::process_attribute<pybind11::arg,_void>::init
              ((process_attribute<pybind11::arg,_void> *)&local_70,
               (EVP_PKEY_CTX *)func_2.super_function.super_object.super_handle.m_ptr);
    *(char **)((long)cVar2.super_function.super_object.super_handle.m_ptr + 8) =
         "\n        get forward kinematic solutions for ur5e\n    ";
    pybind11::cpp_function::initialize_generic
              (&func_1,(unique_function_record *)&func_2,
               "({List[float]}) -> Tuple[List[float], List[List[float]]]",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_ur5e(pybind11::module_&)::$_1,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,std::vector<double,std::allocator<double>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[55]>(pybind11_init_ikfast_ur5e(pybind11::module_&)::$_1&&,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>(*)(std::vector<double,std::allocator<double>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const&[])
                ::types,1);
    std::
    unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   *)&func_2);
    pybind11::object::~object((object *)&local_a8);
    pybind11::object::~object((object *)&func);
    pybind11::module_::add_object
              (&m,"get_fk",(handle)func_1.super_function.super_object.super_handle.m_ptr,true);
    pybind11::object::~object((object *)&func_1);
    mVar1 = m;
    local_a8._M_t.
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
         (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)&func_1,(handle)m.super_object.super_handle.m_ptr,"get_dof",
                      (PyObject *)&_Py_NoneStruct);
    cVar2 = func_1;
    func_2.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pybind11::cpp_function::make_function_record((cpp_function *)&local_70);
    ((PyObject *)(local_70._0_8_ + 0x30))->ob_refcnt =
         (Py_ssize_t)
         pybind11::cpp_function::
         initialize<pybind11_init_ikfast_ur5e(pybind11::module_&)::$_2,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[63]>(pybind11_init_ikfast_ur5e(pybind11::module_&)::$_2&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const(&)[63])
         ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    *(char **)local_70._0_8_ = "get_dof";
    ((PyObject *)(local_70._0_8_ + 0x70))->ob_refcnt =
         (Py_ssize_t)mVar1.super_object.super_handle.m_ptr;
    *(function *)(local_70._0_8_ + 0x78) = cVar2.super_function.super_object.super_handle.m_ptr;
    *(char **)(local_70._0_8_ + 8) =
         "\n        get number dofs configured for the ikfast module\n    ";
    pybind11::cpp_function::initialize_generic
              (&func_2,(unique_function_record *)&local_70,"() -> int",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_ur5e(pybind11::module_&)::$_2,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[63]>(pybind11_init_ikfast_ur5e(pybind11::module_&)::$_2&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const&[])
                ::types,0);
    std::
    unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   *)&local_70);
    pybind11::object::~object((object *)&func_1);
    pybind11::object::~object((object *)&local_a8);
    pybind11::module_::add_object
              (&m,"get_dof",(handle)func_2.super_function.super_object.super_handle.m_ptr,true);
    pybind11::object::~object((object *)&func_2);
    mVar1 = m;
    local_a8._M_t.
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
         (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)&func_1,(handle)m.super_object.super_handle.m_ptr,"get_free_dof",
                      (PyObject *)&_Py_NoneStruct);
    cVar2 = func_1;
    func_2.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pybind11::cpp_function::make_function_record((cpp_function *)&local_70);
    ((PyObject *)(local_70._0_8_ + 0x30))->ob_refcnt =
         (Py_ssize_t)
         pybind11::cpp_function::
         initialize<pybind11_init_ikfast_ur5e(pybind11::module_&)::$_3,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[71]>(pybind11_init_ikfast_ur5e(pybind11::module_&)::$_3&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const(&)[71])
         ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    *(char **)local_70._0_8_ = "get_free_dof";
    ((PyObject *)(local_70._0_8_ + 0x70))->ob_refcnt =
         (Py_ssize_t)mVar1.super_object.super_handle.m_ptr;
    *(function *)(local_70._0_8_ + 0x78) = cVar2.super_function.super_object.super_handle.m_ptr;
    *(char **)(local_70._0_8_ + 8) =
         "\n        get number of free dofs configured for the ikfast module\n    ";
    pybind11::cpp_function::initialize_generic
              (&func_2,(unique_function_record *)&local_70,"() -> int",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_ur5e(pybind11::module_&)::$_3,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[71]>(pybind11_init_ikfast_ur5e(pybind11::module_&)::$_3&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const&[])
                ::types,0);
    std::
    unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   *)&local_70);
    pybind11::object::~object((object *)&func_1);
    pybind11::object::~object((object *)&local_a8);
    pybind11::module_::add_object
              (&m,"get_free_dof",(handle)func_2.super_function.super_object.super_handle.m_ptr,true)
    ;
    pybind11::object::~object((object *)&func_2);
    local_70.obj.m_ptr = (PyObject *)m.super_object.super_handle.m_ptr;
    local_70.key = "__version__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_70,(char (*) [4])"dev");
    pybind11::object::~object(&local_70.cache);
    pybind11::object::~object(&m.super_object);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_MODULE(ikfast_ur5e, m)
{
    m.doc() = R"pbdoc(
        ur5e
        -----------------------
        .. currentmodule:: ikfast_ur5e
        .. autosummary::
           :toctree: _generate
           get_ik
           get_fk
    )pbdoc";

    m.def("get_ik", [](const std::vector<double> &trans_list,
                       const std::vector<std::vector<double>> &rot_list,
                       const std::vector<double> &free_jt_vals)
                    // TODO: default value
    {
      using namespace ikfast;
      IkSolutionList<double> solutions;

      if (free_jt_vals.size() != GetNumFreeParameters()){
          return std::vector<std::vector<double>>();
      }
      double eerot[9], eetrans[3];

      for(std::size_t i = 0; i < 3; ++i)
      {
          eetrans[i] = trans_list[i];
          std::vector<double> rot_vec = rot_list[i];
          for(std::size_t j = 0; j < 3; ++j)
          {
              eerot[3*i + j] = rot_vec[j];
          }
      }

      // call ikfast routine
      bool b_success = ComputeIk(eetrans, eerot, &free_jt_vals[0], solutions);

      std::vector<std::vector<double>> solution_list;
      if (!b_success)
      {
          //fprintf(stderr,"Failed to get ik solution\n");
          return solution_list; // Equivalent to returning None in python
      }

      std::vector<double> solvalues(GetNumJoints());

      // convert all ikfast solutions into a std::vector
      for(std::size_t i = 0; i < solutions.GetNumSolutions(); ++i)
      {
          const IkSolutionBase<double>& sol = solutions.GetSolution(i);
          std::vector<double> vsolfree(sol.GetFree().size());
          sol.GetSolution(&solvalues[0],
                          vsolfree.size() > 0 ? &vsolfree[0] : NULL);

          std::vector<double> individual_solution = std::vector<double>(GetNumJoints());
          for(std::size_t j = 0; j < solvalues.size(); ++j)
          {
              individual_solution[j] = solvalues[j];
          }
          solution_list.push_back(individual_solution);
      }
      return solution_list;
    },
    py::arg("trans_list"),
    py::arg("rot_list"),
    py::arg("free_jt_vals"),
    R"pbdoc(
        get inverse kinematic solutions for ur5e
    )pbdoc");

    m.def("get_fk", [](const std::vector<double> &joint_list)
    {
      using namespace ikfast;
      // eerot is a flattened 3x3 rotation matrix
      double eerot[9], eetrans[3];

      std::vector<double> joints(GetNumJoints());
      for(std::size_t i = 0; i < GetNumJoints(); ++i)
      {
          joints[i] = joint_list[i];
      }

      // call ikfast routine
      ComputeFk(&joints[0], eetrans, eerot);

      // convert computed EE pose to a python object
      std::vector<double> pos(3);
      std::vector<std::vector<double>> rot(3);

      for(std::size_t i = 0; i < 3; ++i)
      {
          pos[i] = eetrans[i];
          std::vector<double> rot_vec(3);
          for( std::size_t j = 0; j < 3; ++j)
          {
              rot_vec[j] = eerot[3*i + j];
          }
          rot[i] = rot_vec;
      }
      return std::make_tuple(pos, rot);
    },
    py::arg("joint_list"),
    R"pbdoc(
        get forward kinematic solutions for ur5e
    )pbdoc");

    m.def("get_dof", []()
    {
      return int(GetNumJoints());
    },
    R"pbdoc(
        get number dofs configured for the ikfast module
    )pbdoc");


    m.def("get_free_dof", []()
    {
      return int(GetNumFreeParameters());
    },
    R"pbdoc(
        get number of free dofs configured for the ikfast module
    )pbdoc");

#ifdef VERSION_INFO
    m.attr("__version__") = VERSION_INFO;
#else
    m.attr("__version__") = "dev";
#endif

}